

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

option_group_definition * __thiscall
VW::config::option_group_definition::add<int>(option_group_definition *this,typed_option<int> *op)

{
  undefined1 local_48 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_30;
  
  std::make_shared<VW::config::typed_option<int>,VW::config::typed_option<int>&>
            ((typed_option<int> *)local_48);
  local_48._16_8_ = local_48._0_8_;
  aStack_30._M_allocated_capacity = local_48._8_8_;
  local_48._0_8_ = (_func_int **)0x0;
  local_48._8_8_ = (pointer)0x0;
  std::
  vector<std::shared_ptr<VW::config::base_option>,std::allocator<std::shared_ptr<VW::config::base_option>>>
  ::emplace_back<std::shared_ptr<VW::config::base_option>>
            ((vector<std::shared_ptr<VW::config::base_option>,std::allocator<std::shared_ptr<VW::config::base_option>>>
              *)&this->m_options,(shared_ptr<VW::config::base_option> *)(local_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_30._M_allocated_capacity);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  return this;
}

Assistant:

option_group_definition& add(typed_option<T> op)
  {
    m_options.push_back(std::make_shared<typed_option<T>>(op));
    return *this;
  }